

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitUnary(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,UnaryExpr e)

{
  Writer *pWVar1;
  char *__s;
  Buffer<char> *pBVar2;
  size_t __n;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_00;
  AssertionFailure *this_00;
  ptrdiff_t _Num;
  size_t sVar3;
  ulong uVar4;
  char *str;
  
  if ((ulong)*(uint *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_
      < 0x48) {
    pWVar1 = this->writer_;
    __s = internal::ExprInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_].
          str;
    __n = strlen(__s);
    pBVar2 = pWVar1->buffer_;
    uVar4 = pBVar2->size_ + __n;
    if (pBVar2->capacity_ < uVar4) {
      (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
    }
    if (__n != 0) {
      memmove(pBVar2->ptr_ + pBVar2->size_,__s,__n);
    }
    pBVar2->size_ = uVar4;
    pBVar2 = pWVar1->buffer_;
    sVar3 = pBVar2->size_;
    if (sVar3 == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar3 + 1);
      sVar3 = pBVar2->size_;
    }
    pBVar2->size_ = sVar3 + 1;
    pBVar2->ptr_[sVar3] = '(';
    e_00 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                     (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                       super_ExprBase.impl_ + 8));
    Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,0);
    pBVar2 = this->writer_->buffer_;
    sVar3 = pBVar2->size_;
    if (sVar3 == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar3 + 1);
      sVar3 = pBVar2->size_;
    }
    pBVar2->size_ = sVar3 + 1;
    pBVar2->ptr_[sVar3] = ')';
    return;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid expression kind");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void VisitUnary(UnaryExpr e) {
    writer_ << str(e.kind()) << '(';
    Visit(e.arg(), prec::UNKNOWN);
    writer_ << ')';
  }